

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_error.hpp
# Opt level: O2

void __thiscall boost::system::system_error::system_error(system_error *this,system_error *param_1)

{
  error_category *peVar1;
  undefined4 uVar2;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,&param_1->super_runtime_error);
  *(undefined ***)this = &PTR__system_error_00123ca8;
  uVar2 = *(undefined4 *)&(param_1->m_error_code).field_0x4;
  peVar1 = (param_1->m_error_code).m_cat;
  (this->m_error_code).m_val = (param_1->m_error_code).m_val;
  *(undefined4 *)&(this->m_error_code).field_0x4 = uVar2;
  (this->m_error_code).m_cat = peVar1;
  std::__cxx11::string::string((string *)&this->m_what,(string *)&param_1->m_what);
  return;
}

Assistant:

class BOOST_SYMBOL_VISIBLE system_error : public std::runtime_error
    // BOOST_SYMBOL_VISIBLE is needed by GCC to ensure system_error thrown from a shared
    // library can be caught. See svn.boost.org/trac/boost/ticket/3697
    {
    public:
      system_error( error_code ec )
          : std::runtime_error(""), m_error_code(ec) {}

      system_error( error_code ec, const std::string & what_arg )
          : std::runtime_error(what_arg), m_error_code(ec) {}

      system_error( error_code ec, const char* what_arg )
          : std::runtime_error(what_arg), m_error_code(ec) {}

      system_error( int ev, const error_category & ecat )
          : std::runtime_error(""), m_error_code(ev,ecat) {}

      system_error( int ev, const error_category & ecat,
        const std::string & what_arg )
          : std::runtime_error(what_arg), m_error_code(ev,ecat) {}

      system_error( int ev, const error_category & ecat,
        const char * what_arg )
          : std::runtime_error(what_arg), m_error_code(ev,ecat) {}

      virtual ~system_error() BOOST_NOEXCEPT_OR_NOTHROW {}

      const error_code &  code() const BOOST_NOEXCEPT_OR_NOTHROW { return m_error_code; }
      const char *        what() const BOOST_NOEXCEPT_OR_NOTHROW;

    private:
      error_code           m_error_code;
      mutable std::string  m_what;
    }